

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

double * __thiscall sptk::Matrix::At(Matrix *this,int row,int column)

{
  out_of_range *this_00;
  const_reference ppdVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  
  if ((((-1 < in_ESI) && (in_ESI < *(int *)(in_RDI + 8))) && (-1 < in_EDX)) &&
     (in_EDX < *(int *)(in_RDI + 0xc))) {
    ppdVar1 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),(long)in_ESI
                        );
    return *ppdVar1 + in_EDX;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,(anonymous_namespace)::kErrorMessageForOutOfRange);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const double& Matrix::At(int row, int column) const {
  if (row < 0 || num_row_ <= row || column < 0 || num_column_ <= column) {
    throw std::out_of_range(kErrorMessageForOutOfRange);
  }
  return index_[row][column];
}